

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.cpp
# Opt level: O1

MetaKeyPairVector * Assimp::Collada::MakeColladaAssimpMetaKeysCamelCase_abi_cxx11_(void)

{
  pointer ppVar1;
  MetaKeyPairVector *__range2;
  MetaKeyPairVector *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *val;
  pointer text;
  
  MakeColladaAssimpMetaKeys_abi_cxx11_();
  ppVar1 = (in_RDI->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (text = (in_RDI->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; text != ppVar1; text = text + 1) {
    ToCamelCase(&text->first);
  }
  return in_RDI;
}

Assistant:

const MetaKeyPairVector MakeColladaAssimpMetaKeysCamelCase() {
    MetaKeyPairVector result = MakeColladaAssimpMetaKeys();
    for (auto &val : result)
    {
        ToCamelCase(val.first);
    }
    return result;
}